

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_complete_chunk
               (png_structrp png_ptr,png_uint_32 chunk_name,png_const_bytep data,size_t length)

{
  uint uVar1;
  uint local_1c;
  
  if (png_ptr != (png_structrp)0x0) {
    if (length >> 0x1f != 0) {
      png_error(png_ptr,"length exceeds PNG maximum");
    }
    png_write_chunk_header(png_ptr,chunk_name,(png_uint_32)length);
    png_write_chunk_data(png_ptr,data,length);
    png_ptr->io_state = 0x82;
    uVar1 = png_ptr->crc;
    local_1c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    png_write_data(png_ptr,(png_const_bytep)&local_1c,4);
  }
  return;
}

Assistant:

static void
png_write_complete_chunk(png_structrp png_ptr, png_uint_32 chunk_name,
    png_const_bytep data, size_t length)
{
   if (png_ptr == NULL)
      return;

   /* On 64-bit architectures 'length' may not fit in a png_uint_32. */
   if (length > PNG_UINT_31_MAX)
      png_error(png_ptr, "length exceeds PNG maximum");

   png_write_chunk_header(png_ptr, chunk_name, (png_uint_32)length);
   png_write_chunk_data(png_ptr, data, length);
   png_write_chunk_end(png_ptr);
}